

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

char * luaL_prepbuffsize(luaL_Buffer *B,size_t sz)

{
  lua_State *L_00;
  ulong local_30;
  size_t newsize;
  char *newbuff;
  lua_State *L;
  size_t sz_local;
  luaL_Buffer *B_local;
  
  L_00 = B->L;
  if (B->size - B->n < sz) {
    local_30 = B->size * 2;
    if (local_30 - B->n < sz) {
      local_30 = B->n + sz;
    }
    if ((local_30 < B->n) || (local_30 - B->n < sz)) {
      luaL_error(L_00,"buffer too large");
    }
    if (B->b == B->initb) {
      newsize = (size_t)newbox(L_00,local_30);
      memcpy((void *)newsize,B->b,B->n);
    }
    else {
      newsize = (size_t)resizebox(L_00,-1,local_30);
    }
    B->b = (char *)newsize;
    B->size = local_30;
  }
  return B->b + B->n;
}

Assistant:

LUALIB_API char *luaL_prepbuffsize (luaL_Buffer *B, size_t sz) {
  lua_State *L = B->L;
  if (B->size - B->n < sz) {  /* not enough space? */
    char *newbuff;
    size_t newsize = B->size * 2;  /* double buffer size */
    if (newsize - B->n < sz)  /* not big enough? */
      newsize = B->n + sz;
    if (newsize < B->n || newsize - B->n < sz)
      luaL_error(L, "buffer too large");
    /* create larger buffer */
    if (buffonstack(B))
      newbuff = (char *)resizebox(L, -1, newsize);
    else {  /* no buffer yet */
      newbuff = (char *)newbox(L, newsize);
      memcpy(newbuff, B->b, B->n * sizeof(char));  /* copy original content */
    }
    B->b = newbuff;
    B->size = newsize;
  }
  return &B->b[B->n];
}